

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O0

void dfft_redistribute_block_to_cyclic_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int size_in,
               int *embed,cpx_t *work,cpx_t *scratch,int *dfft_nsend,int *dfft_nrecv,
               int *dfft_offset_send,int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long lVar8;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  int rank_1;
  int k_1;
  int srcproc;
  int srci;
  int jglob_1;
  int r;
  int offset;
  int r_1;
  int rank;
  int destproc;
  int desti;
  int jglob;
  int offset_1;
  int j;
  int j2;
  int j0;
  int t;
  int k;
  int pdim_tot;
  int npackets;
  int size;
  int ratio;
  int p;
  int s;
  int stride;
  int length;
  int local_a8;
  int local_a4;
  int local_98;
  int local_94;
  int local_8c;
  int local_84;
  int local_80;
  int local_74;
  int local_6c;
  int local_64;
  int local_54;
  int local_48;
  int local_44;
  int local_40;
  
  if (in_R8D != in_R9D) {
    iVar2 = *(int *)(in_RDI + (long)in_ECX * 4) / *(int *)(in_RSI + (long)in_ECX * 4);
    lVar8 = (long)in_ECX;
    iVar3 = in_stack_00000010 / *(int *)(in_stack_00000018 + lVar8 * 4);
    iVar1 = *(int *)(in_stack_00000008 + (long)in_ECX * 4);
    iVar4 = in_R9D / in_R8D;
    if (iVar2 / iVar4 < 2) {
      local_8c = 1;
    }
    else {
      local_8c = iVar2 / iVar4;
    }
    iVar5 = iVar3 * local_8c;
    local_40 = 1;
    for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
      local_40 = *(int *)(in_RSI + (long)local_44 * 4) * local_40;
    }
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      *(undefined4 *)(in_stack_00000030 + (long)local_48 * 4) = 0;
      *(undefined4 *)(in_stack_00000038 + (long)local_48 * 4) = 0;
      *(undefined4 *)(_rank_1 + (long)local_48 * 4) = 0;
      *(undefined4 *)(_srcproc + (long)local_48 * 4) = 0;
    }
    for (local_54 = 0; local_54 < iVar2 / local_8c; local_54 = local_54 + 1) {
      iVar6 = (iVar1 / in_R8D) * in_R8D * iVar2 + local_54 * in_R8D + iVar1 % in_R8D;
      iVar6 = (iVar6 / (in_R9D * iVar2)) * in_R9D + iVar6 % in_R9D;
      local_64 = 0;
      if (rank == 0) {
        for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
          local_98 = iVar6;
          if (in_ECX != local_44) {
            local_98 = *(int *)(in_stack_00000008 + (long)local_44 * 4);
          }
          local_64 = local_98 + *(int *)(in_RSI + (long)local_44 * 4) * local_64;
        }
      }
      else {
        for (local_44 = in_EDX + -1; -1 < local_44; local_44 = local_44 + -1) {
          local_94 = iVar6;
          if (in_ECX != local_44) {
            local_94 = *(int *)(in_stack_00000008 + (long)local_44 * 4);
          }
          local_64 = local_94 + *(int *)(in_RSI + (long)local_44 * 4) * local_64;
        }
      }
      iVar6 = *(int *)(_offset + (long)local_64 * 4);
      *(int *)(in_stack_00000030 + (long)iVar6 * 4) = iVar5 * 8;
      *(int *)(_rank_1 + (long)iVar6 * 4) = local_54 * iVar5 * 8;
      for (local_6c = 0; local_6c < iVar5 / iVar3; local_6c = local_6c + 1) {
        for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
          lVar8 = (long)((local_54 + local_6c * iVar4) * iVar3 + local_44);
          *(undefined8 *)
           (in_stack_00000028 + (long)(local_54 * iVar5 + local_6c * iVar3 + local_44) * 8) =
               *(undefined8 *)(in_stack_00000020 + lVar8 * 8);
        }
      }
    }
    uVar7 = (long)iVar1 % (long)in_R9D;
    for (local_74 = 0; local_74 < iVar2 / local_8c; local_74 = local_74 + 1) {
      iVar4 = (iVar1 / in_R9D) * in_R9D * iVar2 + ((local_74 * iVar5) / iVar3) * in_R9D +
              iVar1 % in_R9D;
      iVar4 = (iVar4 / (in_R8D * iVar2)) * in_R8D + iVar4 % in_R8D;
      local_80 = 0;
      if (rank == 0) {
        for (local_84 = 0; local_84 < in_EDX; local_84 = local_84 + 1) {
          local_a8 = iVar4;
          if (in_ECX != local_84) {
            local_a8 = *(int *)(in_stack_00000008 + (long)local_84 * 4);
          }
          local_80 = local_a8 + *(int *)(in_RSI + (long)local_84 * 4) * local_80;
        }
      }
      else {
        for (local_84 = in_EDX + -1; -1 < local_84; local_84 = local_84 + -1) {
          local_a4 = iVar4;
          if (in_ECX != local_84) {
            local_a4 = *(int *)(in_stack_00000008 + (long)local_84 * 4);
          }
          local_80 = local_a4 + *(int *)(in_RSI + (long)local_84 * 4) * local_80;
        }
      }
      iVar4 = *(int *)(_offset + (long)local_80 * 4);
      *(int *)(in_stack_00000038 + (long)iVar4 * 4) = iVar5 * 8;
      uVar7 = (long)(local_74 * iVar5) << 3;
      *(int *)(_srcproc + (long)iVar4 * 4) = (int)uVar7;
    }
    MPI_Barrier(_jglob_1,lVar8,uVar7 & 0xffffffff);
    MPI_Alltoallv(in_stack_00000028,in_stack_00000030,_rank_1,&ompi_mpi_byte,in_stack_00000020,
                  in_stack_00000038,_srcproc,&ompi_mpi_byte,_jglob_1);
  }
  return;
}

Assistant:

void dfft_redistribute_block_to_cyclic_1d(
                  int *dim,
                  int *pdim,
                  int ndim,
                  int current_dim,
                  int c0,
                  int c1,
                  int* pidx,
                  int size_in,
                  int *embed,
                  cpx_t *work,
                  cpx_t *scratch,
                  int *dfft_nsend,
                  int *dfft_nrecv,
                  int *dfft_offset_send,
                  int *dfft_offset_recv,
                  MPI_Comm comm,
                  int *proc_map,
                  int row_m)
    {
    /* exit early if nothing needs to be done */
    if (c0 == c1) return;

    int length = dim[current_dim]/pdim[current_dim];

    /* compute stride for column major matrix storage */
    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s = pidx[current_dim];
    int p = pdim[current_dim];

    int ratio = c1/c0;
    int size = ((length/ratio > 1) ? (length/ratio) : 1);
    int npackets = length/size;
    size *= stride;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int t;
    for (t = 0; t<pdim_tot; ++t)
        {
        dfft_nsend[t] = 0;
        dfft_nrecv[t] = 0;
        dfft_offset_send[t] = 0;
        dfft_offset_recv[t] = 0;
        }

    int j0;
    int j2;

    j0 = s % c0;
    j2 = s / c0;

    /* initialize send offsets and pack data */
    int j;
    #pragma omp parallel for private(j,k)
    for (j = 0; j < npackets; ++j)
        {
        int offset = j*size;
        int jglob = j2*c0*length + j * c0 + j0;
        int desti = (jglob/(c1*length))*c1+ jglob%c1;
        int destproc = 0;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }

        int rank = proc_map[destproc];
        dfft_nsend[rank] = size*sizeof(cpx_t);
        dfft_offset_send[rank] = offset*sizeof(cpx_t);
        int r;
        for(r=0; r< (size/stride); r++)
            for (k=0; k < stride; k++)
               scratch[offset + r*stride+k]=  work[(j+r*ratio)*stride+k];
        }

    /* initialize recv offsets */
    int offset = 0;
    j0 = s % c1;
    j2 = s/c1;

    int r;
    for (r = 0; r < npackets; ++r)
        {
        offset = r*size;
        j = r*size/stride;
        int jglob = j2*c1*length+ j * c1 + j0;
        int srci = (jglob/(c0*length))*c0+jglob%c0;
        int srcproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >= 0; --k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }

        int rank = proc_map[srcproc];

        dfft_nrecv[rank] = size*sizeof(cpx_t);
        dfft_offset_recv[rank] = offset*sizeof(cpx_t);
        }

    /* synchronize */
    MPI_Barrier(comm);

    /* communicate */
    MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                  work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                  comm);
    }